

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDFace::RotateEdgeArray(ON_SubDFace *this,uint fei0)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  undefined1 *memblock;
  ON_SubDEdgePtr *pOVar3;
  uint uVar4;
  ulong uVar5;
  ON_SubDEdgePtr *pOVar6;
  ON_SubDEdgePtr *pOVar7;
  bool bVar8;
  ON_SubDEdgePtr stack_eptr [8];
  undefined1 auStack_68 [72];
  
  memblock = auStack_68;
  if (fei0 != 0) {
    uVar1 = this->m_edge_count;
    if ((uVar1 <= fei0 || 0xffee < (ushort)(uVar1 - 2)) ||
       ((8 < uVar1 &&
        (memblock = (undefined1 *)onmalloc((ulong)((uint)uVar1 * 8)), memblock == (undefined1 *)0x0)
        ))) {
      return false;
    }
    pOVar3 = this->m_edge4;
    pOVar2 = this->m_edgex;
    pOVar6 = pOVar3;
    for (uVar5 = 0; bVar8 = (uint)uVar1 == uVar5, !bVar8; uVar5 = uVar5 + 1) {
      if (uVar5 == 4 && pOVar2 == (ON_SubDEdgePtr *)0x0) {
        if (memblock == auStack_68) {
          return false;
        }
        goto LAB_005d4d88;
      }
      pOVar7 = pOVar6;
      if (uVar5 == 4) {
        pOVar7 = pOVar2;
      }
      pOVar6 = pOVar7 + 1;
      *(ON__UINT_PTR *)(memblock + uVar5 * 8) = pOVar7->m_ptr;
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      if (uVar4 == 4) {
        pOVar3 = this->m_edgex;
      }
      pOVar3->m_ptr = *(ON__UINT_PTR *)(memblock + ((ulong)(fei0 + uVar4) % (ulong)(uint)uVar1) * 8)
      ;
      pOVar3 = pOVar3 + 1;
    }
    if (memblock != auStack_68) {
LAB_005d4d88:
      onfree(memblock);
      return bVar8;
    }
  }
  return true;
}

Assistant:

bool ON_SubDFace::RotateEdgeArray(
  unsigned int fei0
)
{
  if (0 == fei0)
    return true;

  const unsigned int edge_count = m_edge_count;
  if (edge_count < 2 || edge_count > ON_SubDFace::MaximumEdgeCount || fei0 >= edge_count)
    return false;

  ON_SubDEdgePtr stack_eptr[8];
  ON_SubDEdgePtr* eptr 
    = (edge_count*sizeof(stack_eptr[0]) > sizeof(stack_eptr)) 
    ? ((ON_SubDEdgePtr*)onmalloc(edge_count * sizeof(eptr[0])))
    : stack_eptr;
  if (nullptr == eptr)
    return false;

  ON_SubDEdgePtr* feptr = m_edge4;
  for (unsigned int fei = 0; fei < edge_count; fei++)
  {
    if (4 == fei)
    {
      feptr = m_edgex;
      if (nullptr == feptr)
      {
        if ( eptr != stack_eptr )
          onfree(eptr);  
        return false;
      }
    }
    eptr[fei] = *feptr++;
  }

  feptr = m_edge4;
  for (unsigned int fei = 0; fei < edge_count; fei++)
  {
    if (4 == fei)
      feptr = m_edgex;
    *feptr++ = eptr[(fei + fei0) % edge_count];
  }
  if ( eptr != stack_eptr )
    onfree(eptr);

  return true;
}